

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

ErrorStatus ts_parser__version_status(TSParser *self,StackVersion version)

{
  StackStatus SVar1;
  Stack *self_00;
  StackNode *pSVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  ErrorStatus EVar6;
  
  uVar3 = ts_stack_error_cost(self->stack,version);
  self_00 = self->stack;
  if ((self_00->heads).size <= version) {
    __assert_fail("(uint32_t)version < (&self->heads)->size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/stack.c"
                  ,0x2b0,"_Bool ts_stack_is_paused(const Stack *, StackVersion)");
  }
  SVar1 = (self_00->heads).contents[version].status;
  uVar4 = ts_stack_node_count_since_error(self_00,version);
  if (version < (self->stack->heads).size) {
    pSVar2 = (self->stack->heads).contents[version].node;
    uVar5 = 0x100000000;
    if (SVar1 == StackStatusPaused) {
      uVar3 = uVar3 + 100;
    }
    else if (pSVar2->state != 0) {
      uVar5 = 0;
    }
    EVar6._8_8_ = uVar5 | (uint)pSVar2->dynamic_precedence;
    EVar6.node_count = uVar4;
    EVar6.cost = uVar3;
    return EVar6;
  }
  __assert_fail("(uint32_t)version < (&self->heads)->size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/stack.c"
                ,0x244,"int ts_stack_dynamic_precedence(Stack *, StackVersion)");
}

Assistant:

static ErrorStatus ts_parser__version_status(TSParser *self, StackVersion version) {
  unsigned cost = ts_stack_error_cost(self->stack, version);
  bool is_paused = ts_stack_is_paused(self->stack, version);
  if (is_paused) cost += ERROR_COST_PER_SKIPPED_TREE;
  return (ErrorStatus) {
    .cost = cost,
    .node_count = ts_stack_node_count_since_error(self->stack, version),
    .dynamic_precedence = ts_stack_dynamic_precedence(self->stack, version),
    .is_in_error = is_paused || ts_stack_state(self->stack, version) == ERROR_STATE
  };
}